

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O3

int secp256k1_musig_partial_sign
              (secp256k1_context *ctx,secp256k1_musig_partial_sig *partial_sig,
              secp256k1_musig_secnonce *secnonce,secp256k1_keypair *keypair,
              secp256k1_musig_keyagg_cache *keyagg_cache,secp256k1_musig_session *session)

{
  int iVar1;
  long lVar2;
  uchar *p1;
  undefined1 auVar3 [16];
  secp256k1_scalar sk;
  secp256k1_scalar k [2];
  secp256k1_ge keypair_pk;
  secp256k1_ge pk;
  secp256k1_musig_session_internal session_i;
  secp256k1_keyagg_cache_internal cache_i;
  secp256k1_scalar s;
  secp256k1_scalar mu;
  secp256k1_scalar local_308;
  secp256k1_scalar local_2e8;
  secp256k1_scalar local_2c8;
  secp256k1_ge local_2a8;
  secp256k1_ge local_248;
  secp256k1_musig_session_internal local_1f0;
  secp256k1_keyagg_cache_internal local_168;
  secp256k1_scalar local_70;
  secp256k1_scalar local_50;
  
  if (secnonce == (secp256k1_musig_secnonce *)0x0) {
    secp256k1_musig_partial_sign_cold_7();
  }
  else {
    lVar2 = 0;
    do {
      if (secnonce->data[lVar2] != secp256k1_musig_secnonce_magic[lVar2]) {
        (*(ctx->illegal_callback).fn)
                  ("secp256k1_memcmp_var(&secnonce->data[0], secp256k1_musig_secnonce_magic, 4) == 0"
                   ,(ctx->illegal_callback).data);
        goto LAB_00113cb6;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    auVar3[0] = -((secnonce->data[0x34] == '\0' && secnonce->data[0x24] == '\0') &&
                 (secnonce->data[0x14] == '\0' && secnonce->data[4] == '\0'));
    auVar3[1] = -((secnonce->data[0x35] == '\0' && secnonce->data[0x25] == '\0') &&
                 (secnonce->data[0x15] == '\0' && secnonce->data[5] == '\0'));
    auVar3[2] = -((secnonce->data[0x36] == '\0' && secnonce->data[0x26] == '\0') &&
                 (secnonce->data[0x16] == '\0' && secnonce->data[6] == '\0'));
    auVar3[3] = -((secnonce->data[0x37] == '\0' && secnonce->data[0x27] == '\0') &&
                 (secnonce->data[0x17] == '\0' && secnonce->data[7] == '\0'));
    auVar3[4] = -((secnonce->data[0x38] == '\0' && secnonce->data[0x28] == '\0') &&
                 (secnonce->data[0x18] == '\0' && secnonce->data[8] == '\0'));
    auVar3[5] = -((secnonce->data[0x39] == '\0' && secnonce->data[0x29] == '\0') &&
                 (secnonce->data[0x19] == '\0' && secnonce->data[9] == '\0'));
    auVar3[6] = -((secnonce->data[0x3a] == '\0' && secnonce->data[0x2a] == '\0') &&
                 (secnonce->data[0x1a] == '\0' && secnonce->data[10] == '\0'));
    auVar3[7] = -((secnonce->data[0x3b] == '\0' && secnonce->data[0x2b] == '\0') &&
                 (secnonce->data[0x1b] == '\0' && secnonce->data[0xb] == '\0'));
    auVar3[8] = -((secnonce->data[0x3c] == '\0' && secnonce->data[0x2c] == '\0') &&
                 (secnonce->data[0x1c] == '\0' && secnonce->data[0xc] == '\0'));
    auVar3[9] = -((secnonce->data[0x3d] == '\0' && secnonce->data[0x2d] == '\0') &&
                 (secnonce->data[0x1d] == '\0' && secnonce->data[0xd] == '\0'));
    auVar3[10] = -((secnonce->data[0x3e] == '\0' && secnonce->data[0x2e] == '\0') &&
                  (secnonce->data[0x1e] == '\0' && secnonce->data[0xe] == '\0'));
    auVar3[0xb] = -((secnonce->data[0x3f] == '\0' && secnonce->data[0x2f] == '\0') &&
                   (secnonce->data[0x1f] == '\0' && secnonce->data[0xf] == '\0'));
    auVar3[0xc] = -((secnonce->data[0x40] == '\0' && secnonce->data[0x30] == '\0') &&
                   (secnonce->data[0x20] == '\0' && secnonce->data[0x10] == '\0'));
    auVar3[0xd] = -((secnonce->data[0x41] == '\0' && secnonce->data[0x31] == '\0') &&
                   (secnonce->data[0x21] == '\0' && secnonce->data[0x11] == '\0'));
    auVar3[0xe] = -((secnonce->data[0x42] == '\0' && secnonce->data[0x32] == '\0') &&
                   (secnonce->data[0x22] == '\0' && secnonce->data[0x12] == '\0'));
    auVar3[0xf] = -((secnonce->data[0x43] == '\0' && secnonce->data[0x33] == '\0') &&
                   (secnonce->data[0x23] == '\0' && secnonce->data[0x13] == '\0'));
    local_168.pk.x.n[0] = local_168.pk.x.n[0] & 0xffffffffffffff00;
    local_2a8.x.n[0]._0_4_ =
         (uint)((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar3[0xf] >> 7) << 0xf) == 0xffff);
    if (ctx->declassify != 0) {
      local_168.pk.x.n[0] = 0x4d430002;
      local_168.pk.x.n[1] = (uint64_t)&local_2a8;
      local_168.pk.x.n[2] = 4;
      local_168.pk.x.n[3] = 0;
      local_168.pk.x.n[4] = 0;
      local_168.pk.y.n[0] = 0;
      local_1f0.fin_nonce_parity = 0;
      local_1f0.fin_nonce[0] = '\0';
      local_1f0.fin_nonce[1] = '\0';
      local_1f0.fin_nonce[2] = '\0';
      local_1f0.fin_nonce[3] = '\0';
    }
    if ((uint)local_2a8.x.n[0] != 0) {
      secp256k1_musig_partial_sign_cold_1();
LAB_00113cb6:
      memset(secnonce,0,0x84);
      return 0;
    }
    secp256k1_scalar_set_b32(&local_2e8,secnonce->data + 4,(int *)0x0);
    secp256k1_scalar_set_b32(&local_2c8,secnonce->data + 0x24,(int *)0x0);
    local_168.pk.x.n[0] = *(uint64_t *)(secnonce->data + 0x44);
    local_168.pk.x.n[1] = *(uint64_t *)(secnonce->data + 0x4c);
    local_168.pk.x.n[2] = *(uint64_t *)(secnonce->data + 0x54);
    local_168.pk.x.n[3] = *(uint64_t *)(secnonce->data + 0x5c);
    local_168.pk.x.n[4] = *(uint64_t *)(secnonce->data + 100);
    local_168.pk.y.n[0] = *(uint64_t *)(secnonce->data + 0x6c);
    local_168.pk.y.n[1] = *(uint64_t *)(secnonce->data + 0x74);
    local_168.pk.y.n[2] = *(uint64_t *)(secnonce->data + 0x7c);
    secp256k1_ge_from_storage(&local_248,(secp256k1_ge_storage *)&local_168);
    memset(secnonce,0,0x84);
    if (partial_sig == (secp256k1_musig_partial_sig *)0x0) {
      secp256k1_musig_partial_sign_cold_6();
      return 0;
    }
    if (keypair == (secp256k1_keypair *)0x0) {
      secp256k1_musig_partial_sign_cold_5();
    }
    else if (keyagg_cache == (secp256k1_musig_keyagg_cache *)0x0) {
      secp256k1_musig_partial_sign_cold_4();
    }
    else if (session == (secp256k1_musig_session *)0x0) {
      secp256k1_musig_partial_sign_cold_3();
    }
    else {
      iVar1 = secp256k1_keypair_load(ctx,&local_308,&local_2a8,keypair);
      if (iVar1 != 0) {
        local_168.pk.x.n[0] =
             (CONCAT44(local_2a8.x.n[0]._4_4_,(uint)local_2a8.x.n[0]) - local_248.x.n[0]) +
             0x3ffffbfffff0bc;
        local_168.pk.x.n[1] = (local_2a8.x.n[1] - local_248.x.n[1]) + 0x3ffffffffffffc;
        local_168.pk.x.n[2] = (local_2a8.x.n[2] - local_248.x.n[2]) + 0x3ffffffffffffc;
        local_168.pk.x.n[3] = (local_2a8.x.n[3] - local_248.x.n[3]) + 0x3ffffffffffffc;
        local_168.pk.x.n[4] = (local_2a8.x.n[4] - local_248.x.n[4]) + 0x3fffffffffffc;
        iVar1 = secp256k1_fe_impl_normalizes_to_zero((secp256k1_fe *)&local_168);
        if (iVar1 != 0) {
          local_168.pk.x.n[0] = (local_2a8.y.n[0] - local_248.y.n[0]) + 0x3ffffbfffff0bc;
          local_168.pk.x.n[1] = (local_2a8.y.n[1] - local_248.y.n[1]) + 0x3ffffffffffffc;
          local_168.pk.x.n[2] = (local_2a8.y.n[2] - local_248.y.n[2]) + 0x3ffffffffffffc;
          local_168.pk.x.n[3] = (local_2a8.y.n[3] - local_248.y.n[3]) + 0x3ffffffffffffc;
          local_168.pk.x.n[4] = (local_2a8.y.n[4] - local_248.y.n[4]) + 0x3fffffffffffc;
          iVar1 = secp256k1_fe_impl_normalizes_to_zero((secp256k1_fe *)&local_168);
          if (iVar1 != 0) {
            iVar1 = secp256k1_keyagg_cache_load(ctx,&local_168,keyagg_cache);
            if (iVar1 == 0) {
              return 0;
            }
            if (((uint)local_168.pk.y.n[0] & 1) != local_168.parity_acc) {
              secp256k1_scalar_negate(&local_308,&local_308);
            }
            secp256k1_musig_keyaggcoef_internal
                      (&local_50,local_168.pks_hash,&local_248,&local_168.second_pk);
            secp256k1_scalar_mul(&local_308,&local_308,&local_50);
            iVar1 = secp256k1_musig_session_load(ctx,&local_1f0,session);
            if (iVar1 == 0) {
              return 0;
            }
            if (local_1f0.fin_nonce_parity != 0) {
              secp256k1_scalar_negate(&local_2e8,&local_2e8);
              secp256k1_scalar_negate(&local_2c8,&local_2c8);
            }
            secp256k1_scalar_mul(&local_70,&local_1f0.challenge,&local_308);
            secp256k1_scalar_mul(&local_2c8,&local_1f0.noncecoef,&local_2c8);
            secp256k1_scalar_add(&local_2e8,&local_2e8,&local_2c8);
            secp256k1_scalar_add(&local_70,&local_70,&local_2e8);
            partial_sig->data[0] = 0xeb;
            partial_sig->data[1] = 0xfb;
            partial_sig->data[2] = '\x1a';
            partial_sig->data[3] = '2';
            secp256k1_scalar_get_b32(partial_sig->data + 4,&local_70);
            return 1;
          }
        }
        secp256k1_musig_partial_sign_cold_2();
      }
    }
  }
  return 0;
}

Assistant:

int secp256k1_musig_partial_sign(const secp256k1_context* ctx, secp256k1_musig_partial_sig *partial_sig, secp256k1_musig_secnonce *secnonce, const secp256k1_keypair *keypair, const secp256k1_musig_keyagg_cache *keyagg_cache, const secp256k1_musig_session *session) {
    secp256k1_scalar sk;
    secp256k1_ge pk, keypair_pk;
    secp256k1_scalar k[2];
    secp256k1_scalar mu, s;
    secp256k1_keyagg_cache_internal cache_i;
    secp256k1_musig_session_internal session_i;
    int ret;

    VERIFY_CHECK(ctx != NULL);

    ARG_CHECK(secnonce != NULL);
    /* Fails if the magic doesn't match */
    ret = secp256k1_musig_secnonce_load(ctx, k, &pk, secnonce);
    /* Set nonce to zero to avoid nonce reuse. This will cause subsequent calls
     * of this function to fail */
    memset(secnonce, 0, sizeof(*secnonce));
    if (!ret) {
        secp256k1_musig_partial_sign_clear(&sk, k);
        return 0;
    }

    ARG_CHECK(partial_sig != NULL);
    ARG_CHECK(keypair != NULL);
    ARG_CHECK(keyagg_cache != NULL);
    ARG_CHECK(session != NULL);

    if (!secp256k1_keypair_load(ctx, &sk, &keypair_pk, keypair)) {
        secp256k1_musig_partial_sign_clear(&sk, k);
        return 0;
    }
    ARG_CHECK(secp256k1_fe_equal(&pk.x, &keypair_pk.x)
              && secp256k1_fe_equal(&pk.y, &keypair_pk.y));
    if (!secp256k1_keyagg_cache_load(ctx, &cache_i, keyagg_cache)) {
        secp256k1_musig_partial_sign_clear(&sk, k);
        return 0;
    }

    /* Negate sk if secp256k1_fe_is_odd(&cache_i.pk.y)) XOR cache_i.parity_acc.
     * This corresponds to the line "Let d = g⋅gacc⋅d' mod n" in the
     * specification. */
    if ((secp256k1_fe_is_odd(&cache_i.pk.y)
         != cache_i.parity_acc)) {
        secp256k1_scalar_negate(&sk, &sk);
    }

    /* Multiply KeyAgg coefficient */
    secp256k1_musig_keyaggcoef(&mu, &cache_i, &pk);
    secp256k1_scalar_mul(&sk, &sk, &mu);

    if (!secp256k1_musig_session_load(ctx, &session_i, session)) {
        secp256k1_musig_partial_sign_clear(&sk, k);
        return 0;
    }

    if (session_i.fin_nonce_parity) {
        secp256k1_scalar_negate(&k[0], &k[0]);
        secp256k1_scalar_negate(&k[1], &k[1]);
    }

    /* Sign */
    secp256k1_scalar_mul(&s, &session_i.challenge, &sk);
    secp256k1_scalar_mul(&k[1], &session_i.noncecoef, &k[1]);
    secp256k1_scalar_add(&k[0], &k[0], &k[1]);
    secp256k1_scalar_add(&s, &s, &k[0]);
    secp256k1_musig_partial_sig_save(partial_sig, &s);
    secp256k1_musig_partial_sign_clear(&sk, k);
    return 1;
}